

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

int32_t __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<false>_>::compute_volume
          (fm_operator<ymfm::opn_registers_base<false>_> *this,uint32_t phase,uint32_t am_offset)

{
  uint value;
  uint32_t uVar1;
  uint32_t local_3c;
  int32_t result;
  uint32_t env_attenuation;
  uint32_t sin_attenuation;
  uint32_t am_offset_local;
  uint32_t phase_local;
  fm_operator<ymfm::opn_registers_base<false>_> *this_local;
  
  if (this->m_env_attenuation < 0x381) {
    value = (uint)(this->m_cache).waveform[phase & 0x3ff];
    uVar1 = envelope_attenuation(this,am_offset);
    local_3c = attenuation_to_volume((value & 0x7fff) + uVar1 * 4);
    uVar1 = bitfield(value,0xf,1);
    if (uVar1 != 0) {
      local_3c = -local_3c;
    }
    this_local._4_4_ = local_3c;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t fm_operator<RegisterType>::compute_volume(uint32_t phase, uint32_t am_offset) const
{
	// the low 10 bits of phase represents a full 2*PI period over
	// the full sin wave

	// early out if the envelope is effectively off
	if (m_env_attenuation > EG_QUIET)
		return 0;

	// get the absolute value of the sin, as attenuation, as a 4.8 fixed point value
	uint32_t sin_attenuation = m_cache.waveform[phase & (RegisterType::WAVEFORM_LENGTH - 1)];

	// get the attenuation from the evelope generator as a 4.6 value, shifted up to 4.8
	uint32_t env_attenuation = envelope_attenuation(am_offset) << 2;

	// combine into a 5.8 value, then convert from attenuation to 13-bit linear volume
	int32_t result = attenuation_to_volume((sin_attenuation & 0x7fff) + env_attenuation);

	// negate if in the negative part of the sin wave (sign bit gives 14 bits)
	return bitfield(sin_attenuation, 15) ? -result : result;
}